

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::GenerateFastInlineBuiltInMathRandom(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  RegOpnd *dst;
  RegOpnd *dst_00;
  RegOpnd *src2;
  undefined4 extraout_var;
  MemRefOpnd *pMVar7;
  undefined4 extraout_var_00;
  IntConstOpnd *pIVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  intptr_t pMemLoc;
  Instr *instr_00;
  RegOpnd *this_00;
  
  this_00 = (RegOpnd *)instr->m_dst;
  if (1 < (byte)((this_00->super_Opnd).m_type - TyFloat32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2f99,"(instr->GetDst()->IsFloat())","dst must be float.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    this_00 = (RegOpnd *)instr->m_dst;
  }
  pIVar1 = instr->m_prev;
  iVar4 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x1e])();
  if ((char)iVar4 == '\0') {
    bVar3 = IR::Opnd::IsRegOpnd(&this_00->super_Opnd);
    pRVar6 = this_00;
    if (!bVar3) {
      pRVar6 = IR::RegOpnd::New((this_00->super_Opnd).m_type,instr->m_func);
    }
    LoadScriptContext(this,instr);
    instr_00 = IR::Instr::New(CALL,&pRVar6->super_Opnd,instr->m_func);
    IR::Instr::InsertBefore(instr,instr_00);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr_00,HelperDirectMath_Random,(LabelInstr *)0x0,(Opnd *)0x0,
               (PropertySymOpnd *)0x0,false);
    if (pRVar6 != this_00) {
      InsertMove(&this_00->super_Opnd,&pRVar6->super_Opnd,instr,true);
    }
  }
  else {
    pRVar6 = IR::RegOpnd::New(TyUint64,this->m_func);
    dst = IR::RegOpnd::New(TyUint64,this->m_func);
    dst_00 = IR::RegOpnd::New(TyUint64,this->m_func);
    src2 = IR::RegOpnd::New(TyFloat64,this->m_func);
    iVar4 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x16])();
    pMVar7 = IR::MemRefOpnd::New((void *)(CONCAT44(extraout_var,iVar4) + 0x1db8),TyUint64,
                                 instr->m_func,AddrOpndKindDynamicMisc);
    InsertMove(&pRVar6->super_Opnd,&pMVar7->super_Opnd,instr,true);
    iVar4 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x16])();
    pMVar7 = IR::MemRefOpnd::New((void *)(CONCAT44(extraout_var_00,iVar4) + 0x1db0),TyUint64,
                                 instr->m_func,AddrOpndKindDynamicMisc);
    InsertMove(&dst->super_Opnd,&pMVar7->super_Opnd,instr,true);
    InsertMove(&dst_00->super_Opnd,&dst->super_Opnd,instr,true);
    pIVar8 = IR::IntConstOpnd::New(0x17,TyInt8,this->m_func,false);
    InsertShift(Shl_A,false,&dst_00->super_Opnd,&dst_00->super_Opnd,&pIVar8->super_Opnd,instr);
    InsertXor(&dst->super_Opnd,&dst->super_Opnd,&dst_00->super_Opnd,instr);
    InsertMove(&dst_00->super_Opnd,&dst->super_Opnd,instr,true);
    pIVar8 = IR::IntConstOpnd::New(0x11,TyInt8,this->m_func,false);
    InsertShift(ShrU_A,false,&dst_00->super_Opnd,&dst_00->super_Opnd,&pIVar8->super_Opnd,instr);
    InsertXor(&dst->super_Opnd,&dst->super_Opnd,&dst_00->super_Opnd,instr);
    InsertXor(&dst->super_Opnd,&dst->super_Opnd,&pRVar6->super_Opnd,instr);
    InsertMove(&dst_00->super_Opnd,&pRVar6->super_Opnd,instr,true);
    pIVar8 = IR::IntConstOpnd::New(0x1a,TyInt8,this->m_func,false);
    InsertShift(ShrU_A,false,&dst_00->super_Opnd,&dst_00->super_Opnd,&pIVar8->super_Opnd,instr);
    InsertXor(&dst->super_Opnd,&dst->super_Opnd,&dst_00->super_Opnd,instr);
    iVar4 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x16])();
    pMVar7 = IR::MemRefOpnd::New((void *)(CONCAT44(extraout_var_01,iVar4) + 0x1db0),TyUint64,
                                 this->m_func,AddrOpndKindDynamicMisc);
    InsertMove(&pMVar7->super_Opnd,&pRVar6->super_Opnd,instr,true);
    iVar4 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x16])();
    pMVar7 = IR::MemRefOpnd::New((void *)(CONCAT44(extraout_var_02,iVar4) + 0x1db8),TyUint64,
                                 this->m_func,AddrOpndKindDynamicMisc);
    InsertMove(&pMVar7->super_Opnd,&dst->super_Opnd,instr,true);
    InsertAdd(false,&dst->super_Opnd,&dst->super_Opnd,&pRVar6->super_Opnd,instr);
    pIVar8 = IR::IntConstOpnd::New(0xfffffffffffff,TyInt64,this->m_func,true);
    InsertMove(&dst_00->super_Opnd,&pIVar8->super_Opnd,instr,true);
    InsertAnd(&dst->super_Opnd,&dst->super_Opnd,&dst_00->super_Opnd,instr);
    pIVar8 = IR::IntConstOpnd::New(0x3ff0000000000000,TyInt64,this->m_func,true);
    InsertMove(&dst_00->super_Opnd,&pIVar8->super_Opnd,instr,true);
    InsertOr(&dst->super_Opnd,&dst->super_Opnd,&dst_00->super_Opnd,instr);
    InsertMoveBitCast(&this_00->super_Opnd,&dst->super_Opnd,instr);
    pMemLoc = ThreadContextInfo::GetDoubleOnePointZeroAddr(this->m_func->m_threadContextInfo);
    pMVar7 = IR::MemRefOpnd::New(pMemLoc,TyFloat64,this->m_func,AddrOpndKindDynamicDoubleRef);
    InsertMove(&src2->super_Opnd,&pMVar7->super_Opnd,instr,true);
    InsertSub(false,&this_00->super_Opnd,&this_00->super_Opnd,&src2->super_Opnd,instr);
  }
  IR::Instr::Remove(instr);
  return pIVar1;
}

Assistant:

IR::Instr*
Lowerer::GenerateFastInlineBuiltInMathRandom(IR::Instr* instr)
{
    AssertMsg(instr->GetDst()->IsFloat(), "dst must be float.");
    IR::Instr* retInstr = instr->m_prev;
    IR::Opnd* dst = instr->GetDst();

#if defined(_M_X64)
    if (m_func->GetScriptContextInfo()->IsPRNGSeeded())
    {
        const uint64 mExp = 0x3FF0000000000000;
        const uint64 mMant = 0x000FFFFFFFFFFFFF;

        IR::RegOpnd* r0 = IR::RegOpnd::New(TyUint64, m_func);  // s0
        IR::RegOpnd* r1 = IR::RegOpnd::New(TyUint64, m_func);  // s1
        IR::RegOpnd* r3 = IR::RegOpnd::New(TyUint64, m_func);  // helper uint64 reg
        IR::RegOpnd* r4 = IR::RegOpnd::New(TyFloat64, m_func); // helper float64 reg

        // ===========================================================
        // s0 = scriptContext->GetLibrary()->GetRandSeed1();
        // s1 = scriptContext->GetLibrary()->GetRandSeed0();
        // ===========================================================
        this->InsertMove(r0,
            IR::MemRefOpnd::New((BYTE*)m_func->GetScriptContextInfo()->GetLibraryAddr() + Js::JavascriptLibrary::GetRandSeed1Offset(), TyUint64, instr->m_func), instr);
        this->InsertMove(r1,
            IR::MemRefOpnd::New((BYTE*)m_func->GetScriptContextInfo()->GetLibraryAddr() + Js::JavascriptLibrary::GetRandSeed0Offset(), TyUint64, instr->m_func), instr);

        // ===========================================================
        // s1 ^= s1 << 23;
        // ===========================================================
        this->InsertMove(r3, r1, instr);
        this->InsertShift(Js::OpCode::Shl_A, false, r3, r3, IR::IntConstOpnd::New(23, TyInt8, m_func), instr);
        this->InsertXor(r1, r1, r3, instr);

        // ===========================================================
        // s1 ^= s1 >> 17;
        // ===========================================================
        this->InsertMove(r3, r1, instr);
        this->InsertShift(Js::OpCode::ShrU_A, false, r3, r3, IR::IntConstOpnd::New(17, TyInt8, m_func), instr);
        this->InsertXor(r1, r1, r3, instr);

        // ===========================================================
        // s1 ^= s0;
        // ===========================================================
        this->InsertXor(r1, r1, r0, instr);

        // ===========================================================
        // s1 ^= s0 >> 26;
        // ===========================================================
        this->InsertMove(r3, r0, instr);
        this->InsertShift(Js::OpCode::ShrU_A, false, r3, r3, IR::IntConstOpnd::New(26, TyInt8, m_func), instr);
        this->InsertXor(r1, r1, r3, instr);

        // ===========================================================
        // scriptContext->GetLibrary()->SetRandSeed0(s0);
        // scriptContext->GetLibrary()->SetRandSeed1(s1);
        // ===========================================================
        this->InsertMove(
            IR::MemRefOpnd::New((BYTE*)m_func->GetScriptContextInfo()->GetLibraryAddr() + Js::JavascriptLibrary::GetRandSeed0Offset(), TyUint64, m_func), r0, instr);
        this->InsertMove(
            IR::MemRefOpnd::New((BYTE*)m_func->GetScriptContextInfo()->GetLibraryAddr() + Js::JavascriptLibrary::GetRandSeed1Offset(), TyUint64, m_func), r1, instr);

        // ===========================================================
        // dst = bit_cast<float64>(((s0 + s1) & mMant) | mExp);
        // ===========================================================
        this->InsertAdd(false, r1, r1, r0, instr);
        this->InsertMove(r3, IR::IntConstOpnd::New(mMant, TyInt64, m_func, true), instr);
        this->InsertAnd(r1, r1, r3, instr);
        this->InsertMove(r3, IR::IntConstOpnd::New(mExp, TyInt64, m_func, true), instr);
        this->InsertOr(r1, r1, r3, instr);
        this->InsertMoveBitCast(dst, r1, instr);

        // ===================================================================
        // dst -= 1.0;
        // ===================================================================
        this->InsertMove(r4, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetDoubleOnePointZeroAddr(), TyFloat64, m_func, IR::AddrOpndKindDynamicDoubleRef), instr);
        this->InsertSub(false, dst, dst, r4, instr);
    }
    else
#endif
    {
        IR::Opnd* tmpdst = dst;
        if (!dst->IsRegOpnd())
        {
            tmpdst = IR::RegOpnd::New(dst->GetType(), instr->m_func);
        }

        LoadScriptContext(instr);
        IR::Instr * helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, tmpdst, instr->m_func);
        instr->InsertBefore(helperCallInstr);
        m_lowererMD.ChangeToHelperCall(helperCallInstr, IR::JnHelperMethod::HelperDirectMath_Random);

        if (tmpdst != dst)
        {
            InsertMove(dst, tmpdst, instr);
        }
    }

    instr->Remove();
    return retInstr;
}